

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# percent_decode.c
# Opt level: O1

void percent_decode_bs(BinarySink *bs,ptrlen data)

{
  uchar val;
  BinarySink *bs_00;
  ulong in_RAX;
  ushort **ppuVar1;
  ulong uVar2;
  uchar *puVar3;
  char *p;
  uchar *puVar4;
  char hex [3];
  undefined8 uStack_38;
  uchar *puVar5;
  
  puVar4 = (uchar *)data.ptr;
  if (0 < (long)data.len) {
    puVar3 = puVar4 + data.len;
    uStack_38 = in_RAX;
    do {
      val = *puVar4;
      if ((long)puVar3 - (long)puVar4 < 3 || val != '%') {
LAB_0016dd7b:
        BinarySink_put_byte(bs->binarysink_,val);
        puVar5 = puVar4;
      }
      else {
        ppuVar1 = __ctype_b_loc();
        if (((*(byte *)((long)*ppuVar1 + (ulong)puVar4[1] * 2 + 1) & 0x10) == 0) ||
           ((*(byte *)((long)*ppuVar1 + (ulong)puVar4[2] * 2 + 1) & 0x10) == 0)) goto LAB_0016dd7b;
        puVar5 = puVar4 + 2;
        uStack_38 = (ulong)CONCAT16(puVar4[2],CONCAT15(puVar4[1],(undefined5)uStack_38));
        bs_00 = bs->binarysink_;
        uVar2 = strtoul((char *)((long)&uStack_38 + 5),(char **)0x0,0x10);
        BinarySink_put_byte(bs_00,(uchar)uVar2);
      }
      puVar4 = puVar5 + 1;
    } while (puVar4 < puVar3);
  }
  return;
}

Assistant:

void percent_decode_bs(BinarySink *bs, ptrlen data)
{
    for (const char *p = data.ptr, *e = ptrlen_end(data); p < e; p++) {
        char c = *p;
        if (c == '%' && e-p >= 3 &&
            isxdigit((unsigned char)p[1]) &&
            isxdigit((unsigned char)p[2])) {
            char hex[3];
            hex[0] = p[1];
            hex[1] = p[2];
            hex[2] = '\0';
            put_byte(bs, strtoul(hex, NULL, 16));
            p += 2;
        } else {
            put_byte(bs, c);
        }
    }

}